

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::findDirWatcher(DirWatcherGeneric *this,string *dir)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  DirWatcherGeneric *pDVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  string local_50;
  
  __n = (this->DirSnap).DirectoryInfo.Filepath._M_string_length;
  if ((__n != dir->_M_string_length) ||
     ((__n != 0 &&
      (iVar2 = bcmp((this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p,(dir->_M_dataplus)._M_p,
                    __n), iVar2 != 0)))) {
    p_Var4 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        pDVar3 = *(DirWatcherGeneric **)(p_Var4 + 2);
        pcVar1 = (dir->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + dir->_M_string_length);
        pDVar3 = findDirWatcher(pDVar3,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (pDVar3 != (DirWatcherGeneric *)0x0) {
          return pDVar3;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    this = (DirWatcherGeneric *)0x0;
  }
  return this;
}

Assistant:

DirWatcherGeneric* DirWatcherGeneric::findDirWatcher( std::string dir ) {
	if ( DirSnap.DirectoryInfo.Filepath == dir ) {
		return this;
	} else {
		DirWatcherGeneric* watcher = NULL;

		for ( DirWatchMap::iterator it = Directories.begin(); it != Directories.end(); ++it ) {
			watcher = it->second->findDirWatcher( dir );

			if ( NULL != watcher ) {
				return watcher;
			}
		}
	}

	return NULL;
}